

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_capi_instance_cache.cpp
# Opt level: O1

void background_thread_connect(duckdb_instance_cache instance_cache,char *path)

{
  int iVar1;
  duckdb_state state;
  duckdb_database out_database;
  AssertionHandler catchAssertionHandler;
  int local_e0 [2];
  SourceLineInfo local_d8;
  undefined4 local_bc;
  undefined1 local_b8 [16];
  ITransientExpression local_a8;
  int *local_98;
  char *local_90;
  size_t sStack_88;
  undefined4 *local_80;
  AssertionHandler local_78;
  StringRef local_30;
  
  local_e0[0] = duckdb_get_or_create_from_cache(instance_cache,path,local_b8,0,0);
  local_a8._vptr_ITransientExpression = (_func_int **)0x4b2011;
  local_a8.m_isBinaryExpression = true;
  local_a8.m_result = false;
  local_a8._10_6_ = 0;
  local_d8.file =
       "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/test/api/capi/test_capi_instance_cache.cpp"
  ;
  local_d8.line = 0xe;
  Catch::StringRef::StringRef(&local_30,"state == DuckDBSuccess");
  Catch::AssertionHandler::AssertionHandler
            (&local_78,(StringRef *)&local_a8,&local_d8,local_30,Normal);
  iVar1 = local_e0[0];
  local_bc = 0;
  Catch::StringRef::StringRef((StringRef *)&local_d8,"==");
  local_a8.m_result = iVar1 == 0;
  local_a8.m_isBinaryExpression = true;
  local_a8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_005ced08;
  local_90 = local_d8.file;
  sStack_88 = local_d8.line;
  local_98 = local_e0;
  local_80 = &local_bc;
  Catch::AssertionHandler::handleExpr(&local_78,&local_a8);
  Catch::ITransientExpression::~ITransientExpression(&local_a8);
  Catch::AssertionHandler::complete(&local_78);
  if (local_78.m_completed == false) {
    (*(local_78.m_resultCapture)->_vptr_IResultCapture[0x11])();
  }
  duckdb_close(local_b8);
  return;
}

Assistant:

static void background_thread_connect(duckdb_instance_cache instance_cache, const char *path) {
	try {
		duckdb_database out_database;
		auto state = duckdb_get_or_create_from_cache(instance_cache, path, &out_database, nullptr, nullptr);
		REQUIRE(state == DuckDBSuccess);
		duckdb_close(&out_database);
	} catch (std::exception &ex) {
		FAIL(ex.what());
	}
}